

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

SAM_hdr * cram_read_SAM_hdr(cram_fd *fd)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *hdr;
  size_t sVar5;
  SAM_hdr *pSVar6;
  cram_container *c;
  cram_block *pcVar7;
  void *buffer;
  size_t sVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  int iVar12;
  size_t nbytes;
  int32_t header_len;
  int local_44;
  int local_40;
  int local_3c;
  size_t local_38;
  
  if ((fd->version & 0xffffff00U) == 0x100) {
    iVar3 = int32_decode(fd,&header_len);
    if (iVar3 == -1) {
      return (SAM_hdr *)0x0;
    }
    nbytes = (size_t)header_len;
    hdr = (char *)malloc(nbytes + 1);
    if (hdr == (char *)0x0) {
      return (SAM_hdr *)0x0;
    }
    *hdr = '\0';
    sVar5 = hread(fd->fp,hdr,nbytes);
    if (sVar5 != nbytes) {
      return (SAM_hdr *)0x0;
    }
    fd->first_container = fd->first_container + nbytes + 4;
    goto LAB_00128de1;
  }
  c = cram_read_container(fd);
  if (c == (cram_container *)0x0) {
    return (SAM_hdr *)0x0;
  }
  if ((c->num_blocks < 1) || (pcVar7 = cram_read_block(fd), pcVar7 == (cram_block *)0x0)) {
LAB_001290c3:
    cram_free_container(c);
  }
  else {
    cram_uncompress_block(pcVar7);
    uVar1 = pcVar7->content_id;
    iVar3 = fd->version;
    iVar12 = 1;
    local_3c = iVar12;
    if (0x7f < uVar1) {
      if (uVar1 < 0x4000) {
        local_3c = 2;
      }
      else if (uVar1 < 0x200000) {
        local_3c = 3;
      }
      else {
        local_3c = 5 - (uint)(uVar1 < 0x10000000);
      }
    }
    uVar1 = pcVar7->comp_size;
    uVar2 = pcVar7->uncomp_size;
    local_40 = iVar12;
    if (0x7f < uVar2) {
      if (uVar2 < 0x4000) {
        local_40 = 2;
      }
      else if (uVar2 < 0x200000) {
        local_40 = 3;
      }
      else {
        local_40 = 5 - (uint)(uVar2 < 0x10000000);
      }
    }
    if (0x7f < uVar1) {
      if (uVar1 < 0x4000) {
        iVar12 = 2;
      }
      else if (uVar1 < 0x200000) {
        iVar12 = 3;
      }
      else {
        iVar12 = 5 - (uint)(uVar1 < 0x10000000);
      }
    }
    iVar4 = int32_get(pcVar7,&header_len);
    if ((iVar4 != -1) && (header_len <= pcVar7->uncomp_size + -4)) {
      local_44 = header_len;
      local_38 = (size_t)header_len;
      hdr = (char *)malloc(local_38 + 1);
      sVar11 = local_38;
      if (hdr != (char *)0x0) {
        iVar12 = uVar1 + 2 + (uint)(0x2ff < iVar3) * 4 + local_3c + local_40 + iVar12;
        memcpy(hdr,pcVar7->data + pcVar7->byte,local_38);
        hdr[sVar11] = '\0';
        cram_free_block(pcVar7);
        for (iVar3 = 1; iVar3 < c->num_blocks; iVar3 = iVar3 + 1) {
          pcVar7 = cram_read_block(fd);
          if (pcVar7 == (cram_block *)0x0) goto LAB_001290c3;
          uVar1 = pcVar7->content_id;
          iVar10 = 1;
          iVar4 = iVar10;
          if (((0x7f < uVar1) && (iVar4 = 2, 0x3fff < uVar1)) && (iVar4 = 3, 0x1fffff < uVar1)) {
            iVar4 = 5 - (uint)(uVar1 < 0x10000000);
          }
          uVar1 = pcVar7->uncomp_size;
          iVar9 = iVar10;
          if (((0x7f < uVar1) && (iVar9 = 2, 0x3fff < uVar1)) && (iVar9 = 3, 0x1fffff < uVar1)) {
            iVar9 = 5 - (uint)(uVar1 < 0x10000000);
          }
          uVar1 = pcVar7->comp_size;
          if (((0x7f < uVar1) && (iVar10 = 2, 0x3fff < uVar1)) && (iVar10 = 3, 0x1fffff < uVar1)) {
            iVar10 = 5 - (uint)(uVar1 < 0x10000000);
          }
          iVar12 = iVar12 + uVar1 + iVar4 + iVar9 + (uint)(0x2ff < fd->version) * 4 + iVar10 + 2;
          cram_free_block(pcVar7);
        }
        iVar3 = c->length;
        if ((iVar3 != 0) && (iVar3 - iVar12 != 0 && iVar12 <= iVar3)) {
          sVar11 = (size_t)(iVar3 - iVar12);
          buffer = malloc(sVar11);
          if ((buffer == (void *)0x0) || (sVar8 = hread(fd->fp,buffer,sVar11), sVar8 != sVar11))
          goto LAB_001290c3;
          free(buffer);
        }
        cram_free_container(c);
        header_len = local_44;
LAB_00128de1:
        pSVar6 = sam_hdr_parse_(hdr,header_len);
        free(hdr);
        return pSVar6;
      }
    }
    cram_free_container(c);
    cram_free_block(pcVar7);
  }
  return (SAM_hdr *)0x0;
}

Assistant:

SAM_hdr *cram_read_SAM_hdr(cram_fd *fd) {
    int32_t header_len;
    char *header;
    SAM_hdr *hdr;

    /* 1.1 onwards stores the header in the first block of a container */
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	/* Length */
	if (-1 == int32_decode(fd, &header_len))
	    return NULL;

	/* Alloc and read */
	if (NULL == (header = malloc(header_len+1)))
	    return NULL;

	*header = 0;
	if (header_len != hread(fd->fp, header, header_len))
	    return NULL;

	fd->first_container += 4 + header_len;
    } else {
	cram_container *c = cram_read_container(fd);
	cram_block *b;
	int i, len;

	if (!c)
	    return NULL;

	if (c->num_blocks < 1) {
	    cram_free_container(c);
	    return NULL;
	}

	if (!(b = cram_read_block(fd))) {
	    cram_free_container(c);
	    return NULL;
	}
	cram_uncompress_block(b);

	len = b->comp_size + 2 + 4*(CRAM_MAJOR_VERS(fd->version) >= 3) +
	    itf8_size(b->content_id) + 
	    itf8_size(b->uncomp_size) + 
	    itf8_size(b->comp_size);

	/* Extract header from 1st block */
	if (-1 == int32_get(b, &header_len) ||
	    b->uncomp_size - 4 < header_len) {
	    cram_free_container(c);
	    cram_free_block(b);
	    return NULL;
	}
	if (NULL == (header = malloc(header_len+1))) {
	    cram_free_container(c);
	    cram_free_block(b);
	    return NULL;
	}
	memcpy(header, BLOCK_END(b), header_len);
	header[header_len]='\0';
	cram_free_block(b);

	/* Consume any remaining blocks */
	for (i = 1; i < c->num_blocks; i++) {
	    if (!(b = cram_read_block(fd))) {
		cram_free_container(c);
		return NULL;
	    }
	    len += b->comp_size + 2 + 4*(CRAM_MAJOR_VERS(fd->version) >= 3) +
		itf8_size(b->content_id) + 
		itf8_size(b->uncomp_size) + 
		itf8_size(b->comp_size);
	    cram_free_block(b);
	}

	if (c->length && c->length > len) {
	    // Consume padding
	    char *pads = malloc(c->length - len);
	    if (!pads) {
		cram_free_container(c);
		return NULL;
	    }

	    if (c->length - len != hread(fd->fp, pads, c->length - len)) {
		cram_free_container(c);
		return NULL;
	    }
	    free(pads);
	}

	cram_free_container(c);
    }

    /* Parse */
    hdr = sam_hdr_parse_(header, header_len);
    free(header);

    return hdr;
}